

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

size_t CLI::detail::close_string_quote(string *str,size_t start,char closure_char)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  const_reference pvVar2;
  char in_DL;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  __pos = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1);
  while ((this = __pos,
         pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(in_RDI), __pos < pbVar1 &&
         (pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](this,(size_type)__pos), *pvVar2 != in_DL))) {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](this,(size_type)__pos);
    if (*pvVar2 == '\\') {
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(this->_M_dataplus)._M_p + 1);
    }
    __pos = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(this->_M_dataplus)._M_p + 1);
  }
  return (size_t)this;
}

Assistant:

CLI11_INLINE std::size_t close_string_quote(const std::string &str, std::size_t start, char closure_char) {
    std::size_t loc{0};
    for(loc = start + 1; loc < str.size(); ++loc) {
        if(str[loc] == closure_char) {
            break;
        }
        if(str[loc] == '\\') {
            // skip the next character for escaped sequences
            ++loc;
        }
    }
    return loc;
}